

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Transponder.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Transponder::Encode(IFF_Layer3Transponder *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  LayerHeader::Encode((LayerHeader *)this,stream);
  (*(this->super_IFF_Layer3).m_RptSim.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_IFF_Layer3).m_RptSim,stream);
  (*(this->m_BasicData).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_BasicData,stream);
  KDataStream::Write<unsigned_short>(stream,(this->super_IFF_Layer3).m_ui16Padding);
  KDataStream::Write<unsigned_short>(stream,(this->super_IFF_Layer3).m_ui16NumIffRecs);
  pKVar1 = (this->super_IFF_Layer3).m_vStdVarRecs.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->super_IFF_Layer3).m_vStdVarRecs.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void IFF_Layer3Transponder::Encode( KDataStream & stream ) const
{
    LayerHeader::Encode( stream );

    stream << KDIS_STREAM m_RptSim
           << KDIS_STREAM m_BasicData
           << m_ui16Padding
           << m_ui16NumIffRecs;

    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }	
}